

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void skip(vorb *z,int n)

{
  long lVar1;
  int in_ESI;
  long in_RDI;
  long x;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    lVar1 = (**(code **)(*(long *)(in_RDI + 0x30) + 0x10))(**(undefined8 **)(in_RDI + 0x30),0,1);
    (**(code **)(*(long *)(in_RDI + 0x30) + 0x10))
              (**(undefined8 **)(in_RDI + 0x30),lVar1 + in_ESI,0);
  }
  else {
    *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + (long)in_ESI;
    if (*(ulong *)(in_RDI + 0x50) <= *(ulong *)(in_RDI + 0x40)) {
      *(undefined4 *)(in_RDI + 0x98) = 1;
    }
  }
  return;
}

Assistant:

static void skip(vorb *z, int n)
{
   if (USE_MEMORY(z)) {
      z->stream += n;
      if (z->stream >= z->stream_end) z->eof = 1;
      return;
   }
   #ifndef STB_VORBIS_NO_STDIO
   {
      long x = ftell(z->f);
      fseek(z->f, x+n, SEEK_SET);
   }
   #endif
}